

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

bool __thiscall argparse::Argument::get<bool>(Argument *this)

{
  any *__any;
  undefined1 *puVar1;
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_type *local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  __any = (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (__any == (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_finish) {
    if ((this->mDefaultValue)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_60,"No value provided for \'",
                     (this->mNames).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_60,"\'.");
      paVar3 = &pbVar2->field_2;
      local_40 = (size_type *)(pbVar2->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40 == paVar3) {
        local_30 = paVar3->_M_allocated_capacity;
        uStack_28 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
        local_40 = &local_30;
      }
      else {
        local_30 = paVar3->_M_allocated_capacity;
      }
      local_38 = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      std::logic_error::logic_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    puVar1 = (undefined1 *)std::__any_caster<bool>(&this->mDefaultValue);
  }
  else {
    puVar1 = (undefined1 *)std::__any_caster<bool>(__any);
  }
  if (puVar1 != (undefined1 *)0x0) {
    return (bool)*puVar1;
  }
  std::__throw_bad_any_cast();
}

Assistant:

T get() const {
            if (!mValues.empty()) {
                if constexpr (details::is_container_v<T>)
                    return any_cast_container<T>(mValues);
                else
                    return std::any_cast<T>(mValues.front());
            }
            if (mDefaultValue.has_value()) {
                return std::any_cast<T>(mDefaultValue);
            }
            throw std::logic_error("No value provided for '" + mNames.back() + "'.");
        }